

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt1_endpoint_optimizer::refine_solution(dxt1_endpoint_optimizer *this,int refinement_level)

{
  anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0 aVar1;
  unique_color *puVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  ulong uVar6;
  undefined1 auVar7 [13];
  uchar uVar8;
  uchar uVar9;
  bool bVar10;
  uint16 uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  unsigned_short __tmp;
  int gr;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int br;
  long lVar19;
  int rr;
  byte bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  uint uVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar37;
  undefined1 auVar36 [16];
  double dVar38;
  double dVar39;
  uint uVar40;
  uint uVar41;
  double dVar42;
  color_quad_u8 c [2];
  dxt1_solution_coordinates local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  dxt1_endpoint_optimizer *local_58;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  compute_selectors(this);
  puVar2 = (this->m_unique_colors).m_p;
  dVar21 = 0.0;
  dVar28 = 0.0;
  dVar34 = 0.0;
  dVar42 = 0.0;
  dVar24 = 0.0;
  dVar31 = 0.0;
  dVar32 = 0.0;
  dVar25 = 0.0;
  dVar27 = 0.0;
  for (uVar17 = 0; (this->m_unique_colors).m_size != uVar17; uVar17 = uVar17 + 1) {
    dVar38 = (double)puVar2[uVar17].m_weight;
    aVar1 = puVar2[uVar17].m_color.field_0.field_0;
    uVar6 = (ulong)aVar1._0_2_ & 0xffffffffffff00ff;
    auVar3._8_4_ = 0;
    auVar3._0_8_ = uVar6;
    auVar3[0xc] = aVar1.a;
    auVar4[8] = aVar1.b;
    auVar4._0_8_ = uVar6;
    auVar4[9] = 0;
    auVar4._10_3_ = auVar3._10_3_;
    auVar7._5_8_ = 0;
    auVar7._0_5_ = auVar4._8_5_;
    auVar5[4] = aVar1.g;
    auVar5._0_4_ = (int)uVar6;
    auVar5[5] = 0;
    auVar5._6_7_ = SUB137(auVar7 << 0x40,6);
    dVar33 = (double)puVar2[uVar17].m_color.field_0.field_0.b * dVar38;
    uVar18 = (ulong)(((this->m_best_solution).m_selectors.m_p[uVar17] ^ 1) << 2);
    dVar35 = (double)(int)uVar6 * dVar38;
    dVar37 = (double)auVar5._4_4_ * dVar38;
    dVar24 = dVar24 + (double)*(int *)((long)refine_solution::prods_0 + uVar18) * dVar38;
    dVar39 = (double)*(int *)((long)refine_solution::w1Tab + uVar18);
    dVar31 = dVar31 + (double)*(int *)((long)refine_solution::prods_1 + uVar18) * dVar38;
    dVar32 = dVar32 + (double)*(int *)((long)refine_solution::prods_2 + uVar18) * dVar38;
    dVar42 = dVar42 + dVar39 * dVar35;
    dVar25 = dVar25 + dVar35;
    dVar27 = dVar27 + dVar37;
    dVar34 = dVar34 + dVar37 * dVar39;
    dVar28 = dVar28 + dVar39 * dVar33;
    dVar21 = dVar21 + dVar33;
  }
  local_60._0_1_ = 0;
  if ((((dVar31 != 0.0) || (NAN(dVar31))) && ((dVar32 != 0.0 || (NAN(dVar32))))) &&
     (dVar33 = dVar32 * dVar31 - dVar24 * dVar24, 1.249999968422344e-05 <= ABS(dVar33))) {
    dVar39 = -dVar42;
    dVar38 = dVar25 * 3.0 - dVar42;
    dVar37 = -dVar34;
    dVar25 = dVar27 * 3.0 - dVar34;
    dVar27 = -dVar28;
    dVar21 = dVar21 * 3.0 - dVar28;
    dVar33 = 0.364705890417099 / dVar33;
    dVar35 = dVar33 * 2.0322580337524414;
    uVar14 = (uint)((dVar42 * dVar31 - dVar24 * dVar38) * dVar33 + 0.5);
    if (0x1e < (int)uVar14) {
      uVar14 = 0x1f;
    }
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    local_68 = (ulong)uVar14;
    local_58 = this;
    if (refinement_level == 0) {
      iVar12 = (int)((dVar38 * dVar32 + dVar39 * dVar24) * dVar33 + 0.5);
      iVar15 = 0x1f;
      if (iVar12 < 0x1f) {
        iVar15 = iVar12;
      }
      if (iVar15 < 1) {
        iVar15 = 0;
      }
      auVar36._0_4_ = uVar14 << 0xb;
      auVar36._4_4_ = iVar15 << 0xb;
      auVar36._8_8_ = 0;
      uVar14 = (uint)(dVar35 * (dVar34 * dVar31 + -dVar25 * dVar24) + 0.5);
      uVar26 = (uint)(dVar35 * (dVar25 * dVar32 + dVar37 * dVar24) + 0.5);
      uVar40 = -(uint)((int)uVar14 < 0x3f);
      uVar41 = -(uint)((int)uVar26 < 0x3f);
      uVar14 = ~uVar40 & 0x3f | uVar14 & uVar40;
      uVar26 = ~uVar41 & 0x3f | uVar26 & uVar41;
      auVar30._0_4_ = (int)(dVar33 * (dVar28 * dVar31 + -dVar21 * dVar24) + 0.5);
      auVar30._4_4_ = (int)(dVar33 * (dVar21 * dVar32 + dVar27 * dVar24) + 0.5);
      auVar30._8_8_ = 0;
      auVar23._0_4_ = (-(uint)(0 < (int)uVar14) & uVar14) << 5;
      auVar23._4_4_ = (-(uint)(0 < (int)uVar26) & uVar26) << 5;
      auVar23._8_8_ = 0;
      auVar29._0_4_ = -(uint)(auVar30._0_4_ < (int)DAT_0018cf20);
      auVar29._4_4_ = -(uint)(auVar30._4_4_ < DAT_0018cf20._4_4_);
      auVar29._8_4_ = -(uint)(0 < DAT_0018cf20._8_4_);
      auVar29._12_4_ = -(uint)(0 < DAT_0018cf20._12_4_);
      auVar30 = ~auVar29 & _DAT_0018cf20 | auVar30 & auVar29;
      auVar22._0_4_ = -(uint)(0 < auVar30._0_4_);
      auVar22._4_4_ = -(uint)(0 < auVar30._4_4_);
      auVar22._8_4_ = -(uint)(0 < auVar30._8_4_);
      auVar22._12_4_ = -(uint)(0 < auVar30._12_4_);
      auVar23 = auVar22 & auVar30 | auVar36 | auVar23;
      if (auVar23._4_4_ < auVar23._0_4_) {
        auVar30 = pshuflw(auVar23,auVar23,0xe8);
        c[0].field_0.m_u32 = auVar30._0_4_;
      }
      else {
        auVar30 = pshuflw(auVar23,auVar23,0xe2);
        c[0].field_0.m_u32 = auVar30._0_4_;
      }
      local_60._0_1_ = evaluate_solution(this,(dxt1_solution_coordinates *)c,false);
    }
    else {
      dVar34 = (dVar34 * dVar31 - dVar24 * dVar25) * dVar35 + 0.5;
      if (refinement_level == 1) {
        local_74 = (int)dVar34;
        if (0x3e < local_74) {
          local_74 = 0x3f;
        }
        iVar15 = 0;
        if (local_74 < 1) {
          local_74 = iVar15;
        }
        local_78 = (int)((dVar28 * dVar31 - dVar24 * dVar21) * dVar33 + 0.5);
        if (0x1e < local_78) {
          local_78 = 0x1f;
        }
        if (local_78 < 1) {
          local_78 = iVar15;
        }
        iVar12 = (int)((dVar38 * dVar32 + dVar39 * dVar24) * dVar33 + 0.5);
        if (0x1e < iVar12) {
          iVar12 = 0x1f;
        }
        if (iVar12 < 1) {
          iVar12 = iVar15;
        }
        local_70 = CONCAT44(local_70._4_4_,iVar12);
        local_7c = (uint)((dVar25 * dVar32 + dVar37 * dVar24) * dVar35 + 0.5);
        if (0x3e < (int)local_7c) {
          local_7c = 0x3f;
        }
        if ((int)local_7c < 1) {
          local_7c = iVar15;
        }
        local_80 = (uint)((dVar21 * dVar32 + dVar27 * dVar24) * dVar33 + 0.5);
        if (0x1e < (int)local_80) {
          local_80 = 0x1f;
        }
        if ((int)local_80 < 1) {
          local_80 = iVar15;
        }
        local_60._0_1_ = 0;
        local_60._1_7_ = 0;
        for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
          for (iVar15 = -1; iVar15 != 2; iVar15 = iVar15 + 1) {
            for (iVar12 = -1; iVar12 != 2; iVar12 = iVar12 + 1) {
              iVar16 = -1;
              while( true ) {
                if (iVar16 == 2) break;
                c[0].field_0.field_0.g = (char)local_74;
                c[0].field_0.field_0.r = (char)local_68;
                c[0].field_0.field_0.b = (char)local_78;
                c[0].field_0.field_0.a = 0;
                c[1].field_0.field_0.r = (uchar)local_70;
                c[1].field_0.field_0.g = (uchar)local_7c;
                c[1].field_0.field_0.b = (uchar)local_80;
                c[1].field_0.field_0.a = '\0';
                iVar13 = (uint)c[lVar19].field_0.field_0.r + iVar15;
                if (0x1e < iVar13) {
                  iVar13 = 0x1f;
                }
                uVar8 = '\0';
                uVar9 = (uchar)iVar13;
                if (iVar13 < 1) {
                  uVar9 = uVar8;
                }
                c[lVar19].field_0.field_0.r = uVar9;
                iVar13 = (uint)c[lVar19].field_0.field_0.g + iVar12;
                if (0x3e < iVar13) {
                  iVar13 = 0x3f;
                }
                uVar9 = (uchar)iVar13;
                if (iVar13 < 1) {
                  uVar9 = uVar8;
                }
                c[lVar19].field_0.field_0.g = uVar9;
                iVar13 = (uint)c[lVar19].field_0.field_0.b + iVar16;
                if (0x1e < iVar13) {
                  iVar13 = 0x1f;
                }
                uVar9 = (uchar)iVar13;
                if (iVar13 < 1) {
                  uVar9 = uVar8;
                }
                c[lVar19].field_0.field_0.b = uVar9;
                uVar11 = dxt1_block::pack_color(c,false,0x7f);
                local_84.m_low_color = uVar11;
                local_84.m_high_color = dxt1_block::pack_color(c + 1,false,0x7f);
                if (uVar11 < local_84.m_high_color) {
                  local_84.m_low_color = local_84.m_high_color;
                  local_84.m_high_color = uVar11;
                }
                bVar10 = evaluate_solution(local_58,&local_84,false);
                local_60._0_1_ = (byte)local_60 | bVar10;
                iVar16 = iVar16 + 1;
              }
            }
          }
        }
      }
      else {
        uVar14 = (uint)dVar34;
        if (0x3e < (int)uVar14) {
          uVar14 = 0x3f;
        }
        local_40 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          local_40 = 0;
        }
        uVar14 = (uint)((dVar28 * dVar31 - dVar24 * dVar21) * dVar33 + 0.5);
        if (0x1e < (int)uVar14) {
          uVar14 = 0x1f;
        }
        local_70 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          local_70 = 0;
        }
        local_7c = (uint)((dVar38 * dVar32 + dVar39 * dVar24) * dVar33 + 0.5);
        if (0x1e < (int)local_7c) {
          local_7c = 0x1f;
        }
        uVar14 = 0;
        if ((int)local_7c < 1) {
          local_7c = uVar14;
        }
        local_80 = (uint)((dVar25 * dVar32 + dVar37 * dVar24) * dVar35 + 0.5);
        if (0x3e < (int)local_80) {
          local_80 = 0x3f;
        }
        if ((int)local_80 < 1) {
          local_80 = uVar14;
        }
        local_4c = (uint)((dVar21 * dVar32 + dVar27 * dVar24) * dVar33 + 0.5);
        if (0x1e < (int)local_4c) {
          local_4c = 0x1f;
        }
        if ((int)local_4c < 1) {
          local_4c = uVar14;
        }
        local_60._0_1_ = 0;
        for (local_48 = 0xffffffffffffffff; (int)local_48 != 2;
            local_48 = (ulong)((int)local_48 + 1)) {
          local_78 = (int)local_48 + (int)local_68;
          if (0x1e < local_78) {
            local_78 = 0x1f;
          }
          if (local_78 < 1) {
            local_78 = 0;
          }
          bVar20 = (byte)local_60;
          for (local_38 = 0xffffffffffffffff; (int)local_38 != 2;
              local_38 = (ulong)((int)local_38 + 1)) {
            local_74 = (int)local_38 + (int)local_40;
            if (0x3e < local_74) {
              local_74 = 0x3f;
            }
            if (local_74 < 1) {
              local_74 = 0;
            }
            for (local_60 = 0xffffffff; (int)local_60 != 2; local_60 = (ulong)((int)local_60 + 1)) {
              c[1].field_0._0_1_ = (undefined1)local_7c;
              c[1].field_0._1_1_ = (undefined1)local_80;
              c[1].field_0._2_1_ = (undefined1)local_4c;
              c[1].field_0.field_0.a = '\0';
              c[0].field_0.field_0.g = (char)local_74;
              c[0].field_0.field_0.r = (char)local_78;
              iVar15 = (int)local_70 + (int)local_60;
              if (0x1e < iVar15) {
                iVar15 = 0x1f;
              }
              c[0].field_0._2_1_ = (char)iVar15;
              if (iVar15 < 1) {
                c[0].field_0._2_1_ = 0;
              }
              c[0].field_0.field_0.a = 0;
              for (iVar15 = -1; iVar15 != 2; iVar15 = iVar15 + 1) {
                for (iVar12 = -1; iVar12 != 2; iVar12 = iVar12 + 1) {
                  for (iVar16 = -1; iVar16 != 2; iVar16 = iVar16 + 1) {
                    iVar13 = (uint)(byte)c[1].field_0._0_1_ + iVar15;
                    if (0x1e < (int)((uint)(byte)c[1].field_0._0_1_ + iVar15)) {
                      iVar13 = 0x1f;
                    }
                    c[1].field_0._0_1_ = (undefined1)iVar13;
                    if (iVar13 < 1) {
                      c[1].field_0._0_1_ = '\0';
                    }
                    iVar13 = (uint)(byte)c[1].field_0._1_1_ + iVar12;
                    if (0x3e < iVar13) {
                      iVar13 = 0x3f;
                    }
                    c[1].field_0._1_1_ = (undefined1)iVar13;
                    if (iVar13 < 1) {
                      c[1].field_0._1_1_ = '\0';
                    }
                    iVar13 = (uint)(byte)c[1].field_0._2_1_ + iVar16;
                    if (0x1e < iVar13) {
                      iVar13 = 0x1f;
                    }
                    c[1].field_0._2_1_ = (undefined1)iVar13;
                    if (iVar13 < 1) {
                      c[1].field_0._2_1_ = '\0';
                    }
                    uVar11 = dxt1_block::pack_color(c,false,0x7f);
                    local_84.m_low_color = uVar11;
                    local_84.m_high_color = dxt1_block::pack_color(c + 1,false,0x7f);
                    if (uVar11 < local_84.m_high_color) {
                      local_84.m_low_color = local_84.m_high_color;
                      local_84.m_high_color = uVar11;
                    }
                    bVar10 = evaluate_solution(local_58,&local_84,false);
                    bVar20 = bVar20 | bVar10;
                  }
                }
              }
            }
          }
          local_60._0_1_ = bVar20;
        }
      }
    }
  }
  return (bool)((byte)local_60 & 1);
}

Assistant:

bool dxt1_endpoint_optimizer::refine_solution(int refinement_level)
    {
        compute_selectors();

        static const int w1Tab[4] = { 3, 0, 2, 1 };

        static const int prods_0[4] = { 0x00, 0x00, 0x02, 0x02 };
        static const int prods_1[4] = { 0x00, 0x09, 0x01, 0x04 };
        static const int prods_2[4] = { 0x09, 0x00, 0x04, 0x01 };

        double akku_0 = 0;
        double akku_1 = 0;
        double akku_2 = 0;
        double At1_r, At1_g, At1_b;
        double At2_r, At2_g, At2_b;

        At1_r = At1_g = At1_b = 0;
        At2_r = At2_g = At2_b = 0;
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            const color_quad_u8& c = m_unique_colors[i].m_color;
            const double weight = m_unique_colors[i].m_weight;

            double r = c.r * weight;
            double g = c.g * weight;
            double b = c.b * weight;
            int step = m_best_solution.m_selectors[i] ^ 1;

            int w1 = w1Tab[step];

            akku_0 += prods_0[step] * weight;
            akku_1 += prods_1[step] * weight;
            akku_2 += prods_2[step] * weight;
            At1_r += w1 * r;
            At1_g += w1 * g;
            At1_b += w1 * b;
            At2_r += r;
            At2_g += g;
            At2_b += b;
        }

        At2_r = 3 * At2_r - At1_r;
        At2_g = 3 * At2_g - At1_g;
        At2_b = 3 * At2_b - At1_b;

        double xx = akku_2;
        double yy = akku_1;
        double xy = akku_0;

        double t = xx * yy - xy * xy;
        if (!yy || !xx || (fabs(t) < .0000125f))
        {
            return false;
        }

        double frb = (3.0f * 31.0f / 255.0f) / t;
        double fg = frb * (63.0f / 31.0f);

        bool improved = false;

        if (refinement_level == 0)
        {
            uint max16;
            max16 = math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31) << 11;
            max16 |= math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63) << 5;
            max16 |= math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31) << 0;

            uint min16;
            min16 = math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31) << 11;
            min16 |= math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63) << 5;
            min16 |= math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31) << 0;

            dxt1_solution_coordinates nc((uint16)min16, (uint16)max16);
            nc.canonicalize();
            improved |= evaluate_solution(nc);
        }
        else if (refinement_level == 1)
        {
            // Try exploring the local lattice neighbors of the least squares optimized result.
            color_quad_u8 e[2];

            e[0].clear();
            e[0][0] = (uint8)math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31);
            e[0][1] = (uint8)math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63);
            e[0][2] = (uint8)math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31);

            e[1].clear();
            e[1][0] = (uint8)math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31);
            e[1][1] = (uint8)math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63);
            e[1][2] = (uint8)math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31);

            for (uint i = 0; i < 2; i++)
            {
                for (int rr = -1; rr <= 1; rr++)
                {
                    for (int gr = -1; gr <= 1; gr++)
                    {
                        for (int br = -1; br <= 1; br++)
                        {
                            dxt1_solution_coordinates nc;

                            color_quad_u8 c[2];
                            c[0] = e[0];
                            c[1] = e[1];

                            c[i][0] = (uint8)math::clamp<int>(c[i][0] + rr, 0, 31);
                            c[i][1] = (uint8)math::clamp<int>(c[i][1] + gr, 0, 63);
                            c[i][2] = (uint8)math::clamp<int>(c[i][2] + br, 0, 31);

                            nc.m_low_color = dxt1_block::pack_color(c[0], false);
                            nc.m_high_color = dxt1_block::pack_color(c[1], false);

                            nc.canonicalize();
                            improved |= evaluate_solution(nc);
                        }
                    }
                }
            }
        }
        else
        {
            // Try even harder to explore the local lattice neighbors of the least squares optimized result.
            color_quad_u8 e[2];
            e[0].clear();
            e[0][0] = (uint8)math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31);
            e[0][1] = (uint8)math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63);
            e[0][2] = (uint8)math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31);

            e[1].clear();
            e[1][0] = (uint8)math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31);
            e[1][1] = (uint8)math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63);
            e[1][2] = (uint8)math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31);

            for (int orr = -1; orr <= 1; orr++)
            {
                for (int ogr = -1; ogr <= 1; ogr++)
                {
                    for (int obr = -1; obr <= 1; obr++)
                    {
                        dxt1_solution_coordinates nc;

                        color_quad_u8 c[2];
                        c[0] = e[0];
                        c[1] = e[1];

                        c[0][0] = (uint8)math::clamp<int>(c[0][0] + orr, 0, 31);
                        c[0][1] = (uint8)math::clamp<int>(c[0][1] + ogr, 0, 63);
                        c[0][2] = (uint8)math::clamp<int>(c[0][2] + obr, 0, 31);

                        for (int rr = -1; rr <= 1; rr++)
                        {
                            for (int gr = -1; gr <= 1; gr++)
                            {
                                for (int br = -1; br <= 1; br++)
                                {
                                    c[1][0] = (uint8)math::clamp<int>(c[1][0] + rr, 0, 31);
                                    c[1][1] = (uint8)math::clamp<int>(c[1][1] + gr, 0, 63);
                                    c[1][2] = (uint8)math::clamp<int>(c[1][2] + br, 0, 31);

                                    nc.m_low_color = dxt1_block::pack_color(c[0], false);
                                    nc.m_high_color = dxt1_block::pack_color(c[1], false);
                                    nc.canonicalize();

                                    improved |= evaluate_solution(nc);
                                }
                            }
                        }
                    }
                }
            }
        }

        return improved;
    }